

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addLagrangeTerm
          (OptimalControlProblem *this,double weight,double startingTime,double finalTime,
          shared_ptr<iDynTree::optimalcontrol::QuadraticCost> *quadraticCost)

{
  OptimalControlProblemPimpl *this_00;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  TimeRange timeRange;
  ostringstream errorMsg;
  shared_ptr<iDynTree::optimalcontrol::Cost> local_1f0;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  TimeRange local_1a8;
  string local_190 [3];
  ios_base local_120 [264];
  
  local_1e0 = weight;
  local_1d8 = startingTime;
  local_1d0 = finalTime;
  TimeRange::TimeRange(&local_1a8);
  bVar1 = TimeRange::setTimeInterval(&local_1a8,local_1d8,local_1d0);
  if (bVar1) {
    this_00 = this->m_pimpl;
    local_1f0.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)
           (quadraticCost->
           super___shared_ptr<iDynTree::optimalcontrol::QuadraticCost,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
    local_1f0.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (quadraticCost->
         super___shared_ptr<iDynTree::optimalcontrol::QuadraticCost,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_1f0.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1f0.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1f0.
              super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1f0.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1f0.
              super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_190[0]._M_dataplus._M_p = (pointer)&local_190[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"addLagrangeTerm","");
    bVar1 = OptimalControlProblemPimpl::addCost
                      (this_00,local_1e0,&local_1a8,&local_1f0,false,true,local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190[0]._M_dataplus._M_p != &local_190[0].field_2) {
      operator_delete(local_190[0]._M_dataplus._M_p,local_190[0].field_2._M_allocated_capacity + 1);
    }
    if (local_1f0.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f0.
                 super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"The cost named ",0xf);
    psVar2 = Cost::name_abi_cxx11_
                       ((Cost *)(quadraticCost->
                                super___shared_ptr<iDynTree::optimalcontrol::QuadraticCost,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," has invalid time settings.",0x1b);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("OptimalControlProblem","addLagrangeTerm",(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OptimalControlProblem::addLagrangeTerm(double weight, double startingTime, double finalTime, std::shared_ptr<QuadraticCost> quadraticCost)
        {
            TimeRange timeRange;

            if (!timeRange.setTimeInterval(startingTime, finalTime)){
                std::ostringstream errorMsg;
                errorMsg << "The cost named " << quadraticCost->name() <<" has invalid time settings.";
                reportError("OptimalControlProblem", "addLagrangeTerm", errorMsg.str().c_str());
                return false;
            }

            return (m_pimpl->addCost(weight, timeRange, quadraticCost, false, true, "addLagrangeTerm"));
        }